

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

ssize_t MAFSA_automaton_search
                  (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *out,size_t sz_out,
                  size_t *sz_out_result)

{
  int iVar1;
  uint32_t uVar2;
  void *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  ulong in_R8;
  size_t *in_R9;
  ssize_t cpy_sz;
  MAFSA_letter label;
  uint32_t where;
  uint32_t current;
  uint32_t i;
  ssize_t cur_pos;
  size_t local_68;
  MAFSA_letter in_stack_ffffffffffffffa3;
  uint in_stack_ffffffffffffffa4;
  uint32_t *in_stack_ffffffffffffffa8;
  uint32_t local_48;
  uint local_44;
  ulong local_40;
  
  local_40 = 0;
  do {
    if (in_RDX <= local_40) {
      return -1;
    }
    local_44 = (uint)local_40;
    local_48 = *(uint32_t *)*in_RDI;
    while( true ) {
      in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 & 0xffffff;
      if (local_44 < in_RDX) {
        iVar1 = node_is_final(local_48);
        in_stack_ffffffffffffffa4 =
             CONCAT13(iVar1 != 0,(int3)in_stack_ffffffffffffffa4) ^ 0xff000000;
      }
      if ((in_stack_ffffffffffffffa4 & 0x1000000) == 0) break;
      local_44 = local_44 + 1;
      uVar2 = MAFSA_delta(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                          in_stack_ffffffffffffffa3);
      if (uVar2 == 0) break;
      local_48 = *(uint32_t *)(*in_RDI + (ulong)uVar2 * 4);
    }
    iVar1 = node_is_final(local_48);
    if (iVar1 != 0) {
      local_68 = in_R8;
      if (local_44 - local_40 < in_R8) {
        local_68 = local_44 - local_40;
      }
      memcpy(in_RCX,(void *)(in_RSI + local_40),local_68);
      if (in_R9 != (size_t *)0x0) {
        *in_R9 = local_68;
      }
      return local_40;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

extern ssize_t MAFSA_automaton_search(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l,
    MAFSA_letter *out, size_t sz_out, size_t *sz_out_result)
{
    ssize_t cur_pos;

    for (cur_pos = 0; cur_pos < sz_l; cur_pos++)
    {
        uint32_t i = cur_pos;
        uint32_t current = ma->ptr_nodes[0];
        uint32_t where = 0;

        while (i < sz_l && !node_is_final(current))
        {
            MAFSA_letter label = l[i++];

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
            {
                current = ma->ptr_nodes[where];
            }
            else
            {
                break;
            }
        }

        if (node_is_final(current))
        {
            ssize_t cpy_sz;
            
            cpy_sz = i - cur_pos < sz_out ? i - cur_pos : sz_out;
            memcpy(out, l + cur_pos, cpy_sz);

            if (sz_out_result)
            {
                *sz_out_result = cpy_sz;
            }

            return cur_pos;
        }
    }

    return -1;
}